

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void delete_expr(Context_conflict *ctx,MOJOSHADER_astExpression *_expr)

{
  MOJOSHADER_astNodeType MVar1;
  MOJOSHADER_astNode *expr;
  MOJOSHADER_astExpression *_expr_00;
  MOJOSHADER_astArguments *args;
  
  if (_expr == (MOJOSHADER_astExpression *)0x0) {
    return;
  }
  MVar1 = (_expr->ast).type;
  if (MVar1 == MOJOSHADER_AST_OP_CONSTRUCTOR) {
    args = *(MOJOSHADER_astArguments **)&_expr[1].ast;
LAB_0012cda6:
    delete_arguments(ctx,args);
  }
  else {
    if (((MVar1 == MOJOSHADER_AST_OP_DEREF_STRUCT) || (MVar1 == MOJOSHADER_AST_OP_CAST)) ||
       (0xfffffff7 < MVar1 - MOJOSHADER_AST_OP_END_RANGE_UNARY)) {
      _expr_00 = *(MOJOSHADER_astExpression **)&_expr[1].ast;
    }
    else if (MVar1 - MOJOSHADER_AST_OP_END_RANGE_BINARY < 0xffffffe1) {
      if (MVar1 == MOJOSHADER_AST_OP_CALLFUNC) {
        delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
        args = (MOJOSHADER_astArguments *)_expr[1].ast.filename;
        goto LAB_0012cda6;
      }
      if (MVar1 != MOJOSHADER_AST_OP_CONDITIONAL) goto LAB_0012cdae;
      delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
      delete_expr(ctx,(MOJOSHADER_astExpression *)_expr[1].ast.filename);
      _expr_00 = *(MOJOSHADER_astExpression **)&_expr[1].ast.line;
    }
    else {
      delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
      _expr_00 = (MOJOSHADER_astExpression *)_expr[1].ast.filename;
    }
    delete_expr(ctx,_expr_00);
  }
LAB_0012cdae:
  (*ctx->free)(_expr,ctx->malloc_data);
  return;
}

Assistant:

static void delete_expr(Context *ctx, MOJOSHADER_astExpression *_expr)
{
    MOJOSHADER_astNode *expr = (MOJOSHADER_astNode *) _expr;

    DELETE_AST_NODE(expr);

    if (expr->ast.type == MOJOSHADER_AST_OP_CAST)
        delete_expr(ctx, expr->cast.operand);

    else if (expr->ast.type == MOJOSHADER_AST_OP_CONSTRUCTOR)
        delete_arguments(ctx, expr->constructor.args);

    else if (expr->ast.type == MOJOSHADER_AST_OP_DEREF_STRUCT)
        delete_expr(ctx, expr->derefstruct.identifier);

    else if (operator_is_unary(expr->ast.type))
        delete_expr(ctx, expr->unary.operand);

    else if (operator_is_binary(expr->ast.type))
    {
        delete_expr(ctx, expr->binary.left);
        delete_expr(ctx, expr->binary.right);
    } // else if

    else if (operator_is_ternary(expr->ast.type))
    {
        delete_expr(ctx, expr->ternary.left);
        delete_expr(ctx, expr->ternary.center);
        delete_expr(ctx, expr->ternary.right);
    } // else if

    else if (expr->ast.type == MOJOSHADER_AST_OP_CALLFUNC)
    {
        delete_expr(ctx, (MOJOSHADER_astExpression*)expr->callfunc.identifier);
        delete_arguments(ctx, expr->callfunc.args);
    } // else if

    // rest of operators don't have extra data to free.

    Free(ctx, expr);
}